

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::DTDScanner::scanCharRef(DTDScanner *this,XMLCh *first,XMLCh *second)

{
  bool bVar1;
  bool bVar2;
  XMLCh XVar3;
  UnexpectedEOFException *this_00;
  XMLReader *pXVar4;
  XMLCh local_4c [2];
  uint local_48;
  XMLCh tmpStr [2];
  uint nextVal;
  uint local_34;
  uint uStack_30;
  XMLCh nextCh;
  uint radix;
  uint value;
  bool gotOne;
  XMLCh *second_local;
  XMLCh *first_local;
  DTDScanner *this_local;
  
  bVar2 = false;
  uStack_30 = 0;
  local_34 = 10;
  bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'x');
  if (bVar1) {
    local_34 = 0x10;
  }
  else {
    bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'X');
    if (bVar1) {
      XMLScanner::emitError(this->fScanner,HexRadixMustBeLowerCase);
      local_34 = 0x10;
    }
  }
  while( true ) {
    XVar3 = ReaderMgr::peekNextChar(this->fReaderMgr);
    if (XVar3 == L'\0') {
      this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDScanner.cpp"
                 ,0x3bc,Gen_UnexpectedEOF,this->fMemoryManager);
      __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,
                  UnexpectedEOFException::~UnexpectedEOFException);
    }
    if (XVar3 == L';') break;
    if (((ushort)XVar3 < 0x30) || (0x39 < (ushort)XVar3)) {
      if (((ushort)XVar3 < 0x41) || (0x46 < (ushort)XVar3)) {
        if (((ushort)XVar3 < 0x61) || (0x66 < (ushort)XVar3)) {
          if (bVar2) {
            XMLScanner::emitError(this->fScanner,UnterminatedCharRef);
          }
          else {
            XMLScanner::emitError(this->fScanner,ExpectedNumericalCharRef);
          }
          return false;
        }
        local_48 = (ushort)XVar3 - 0x57;
      }
      else {
        local_48 = (ushort)XVar3 - 0x37;
      }
    }
    else {
      local_48 = (ushort)XVar3 - 0x30;
    }
    if (local_48 < local_34) {
      uStack_30 = uStack_30 * local_34 + local_48;
    }
    else {
      local_4c[1] = 0;
      local_4c[0] = XVar3;
      XMLScanner::emitError
                (this->fScanner,BadDigitForRadix,local_4c,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    bVar2 = true;
    ReaderMgr::getNextChar(this->fReaderMgr);
  }
  ReaderMgr::getNextChar(this->fReaderMgr);
  if ((uStack_30 < 0x10000) || (0x10ffff < uStack_30)) {
    if (0xfffd < uStack_30) {
      XMLScanner::emitError(this->fScanner,InvalidCharacterRef);
      return false;
    }
    *first = (XMLCh)uStack_30;
    *second = L'\0';
    pXVar4 = ReaderMgr::getCurrentReader(this->fReaderMgr);
    bVar2 = XMLReader::isXMLChar(pXVar4,*first);
    if (!bVar2) {
      pXVar4 = ReaderMgr::getCurrentReader(this->fReaderMgr);
      bVar2 = XMLReader::isControlChar(pXVar4,*first);
      if (!bVar2) {
        XMLScanner::emitError(this->fScanner,InvalidCharacterRef);
        return false;
      }
    }
  }
  else {
    *first = (short)(uStack_30 - 0x10000 >> 10) + L'\xd800';
    *second = ((ushort)(uStack_30 - 0x10000) & 0x3ff) + L'\xdc00';
  }
  return true;
}

Assistant:

bool DTDScanner::scanCharRef(XMLCh& first, XMLCh& second)
{
    bool gotOne = false;
    unsigned int value = 0;

    //
    //  Set the radix. Its supposed to be a lower case x if hex. But, in
    //  order to recover well, we check for an upper and put out an error
    //  for that.
    //
    unsigned int radix = 10;

    if (fReaderMgr->skippedChar(chLatin_x))
    {
        radix = 16;
    }
     else if (fReaderMgr->skippedChar(chLatin_X))
    {
        fScanner->emitError(XMLErrs::HexRadixMustBeLowerCase);
        radix = 16;
    }

    while (true)
    {
        const XMLCh nextCh = fReaderMgr->peekNextChar();

        // Watch for EOF
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        // Break out on the terminating semicolon
        if (nextCh == chSemiColon)
        {
            fReaderMgr->getNextChar();
            break;
        }

        //
        //  Convert this char to a binary value, or bail out if its not
        //  one.
        //
        unsigned int nextVal;
        if ((nextCh >= chDigit_0) && (nextCh <= chDigit_9))
            nextVal = (unsigned int)(nextCh - chDigit_0);
        else if ((nextCh >= chLatin_A) && (nextCh <= chLatin_F))
            nextVal= (unsigned int)(10 + (nextCh - chLatin_A));
        else if ((nextCh >= chLatin_a) && (nextCh <= chLatin_f))
            nextVal = (unsigned int)(10 + (nextCh - chLatin_a));
        else
        {
            //
            //  If we got at least a sigit, then do an unterminated ref
            //  error. Else, do an expected a numerical ref thing.
            //
            if (gotOne)
                fScanner->emitError(XMLErrs::UnterminatedCharRef);
            else
                fScanner->emitError(XMLErrs::ExpectedNumericalCharRef);

            return false;
        }

        //
        //  Make sure its valid for the radix. If not, then just eat the
        //  digit and go on after issueing an error. Else, update the
        //  running value with this new digit.
        //
        if (nextVal >= radix)
        {
            XMLCh tmpStr[2];
            tmpStr[0] = nextCh;
            tmpStr[1] = chNull;
            fScanner->emitError(XMLErrs::BadDigitForRadix, tmpStr);
        }
         else
        {
            value = (value * radix) + nextVal;
        }

        // Indicate that we got at least one good digit
        gotOne = true;

        // Eat the char we just processed
        fReaderMgr->getNextChar();
    }

    // Return the char (or chars)
    // And check if the character expanded is valid or not
    if (value >= 0x10000 && value <= 0x10FFFF)
    {
        value -= 0x10000;
        first  = XMLCh((value >> 10) + 0xD800);
        second = XMLCh((value & 0x3FF) + 0xDC00);
    }
    else if (value <= 0xFFFD)
    {
        first  = XMLCh(value);
        second = 0;
        if (!fReaderMgr->getCurrentReader()->isXMLChar(first) && !fReaderMgr->getCurrentReader()->isControlChar(first)) {
            // Character reference was not in the valid range
            fScanner->emitError(XMLErrs::InvalidCharacterRef);
            return false;
        }
    }
    else {
        // Character reference was not in the valid range
        fScanner->emitError(XMLErrs::InvalidCharacterRef);
        return false;
    }

    return true;
}